

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

void uv__udp_run_completed(uv_udp_t *handle)

{
  uint *puVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  ulong uVar8;
  char *__assertion;
  
  if ((handle->flags >> 0x11 & 1) == 0) {
    handle->flags = handle->flags | 0x20000;
    while( true ) {
      plVar3 = (long *)handle->write_completed_queue[0];
      if (handle->write_completed_queue == (void **)plVar3) {
        if (handle->write_queue == (void **)handle->write_queue[0]) {
          uv__io_stop(handle->loop,&handle->io_watcher,4);
          iVar5 = uv__io_active(&handle->io_watcher,1);
          uVar2 = handle->flags;
          uVar6 = uVar2;
          if (((uVar2 >> 0xe & 1) != 0 && iVar5 == 0) &&
             (uVar6 = uVar2 & 0xffffbfff, (uVar2 >> 0xd & 1) != 0)) {
            puVar1 = &handle->loop->active_handles;
            *puVar1 = *puVar1 - 1;
          }
        }
        else {
          uVar6 = handle->flags;
        }
        handle->flags = uVar6 & 0xfffdffff;
        return;
      }
      lVar4 = *plVar3;
      *(long *)plVar3[1] = lVar4;
      *(long *)(lVar4 + 8) = plVar3[1];
      if (handle->loop->active_reqs == (void **)handle->loop->active_reqs[0]) break;
      lVar4 = plVar3[-8];
      *(long *)plVar3[-7] = lVar4;
      *(long *)(lVar4 + 8) = plVar3[-7];
      sVar7 = uv__count_bufs((uv_buf_t *)plVar3[0x13],*(uint *)(plVar3 + 0x12));
      handle->send_queue_size = handle->send_queue_size - sVar7;
      handle->send_queue_count = handle->send_queue_count - 1;
      if ((long *)plVar3[0x13] != plVar3 + 0x16) {
        uv__free((long *)plVar3[0x13]);
      }
      plVar3[0x13] = 0;
      if ((code *)plVar3[0x15] != (code *)0x0) {
        uVar8 = plVar3[0x14] & 0xffffffff;
        if (-1 < plVar3[0x14]) {
          uVar8 = 0;
        }
        (*(code *)plVar3[0x15])(plVar3 + -10,uVar8);
      }
    }
    __assertion = "uv__has_active_reqs(handle->loop)";
    uVar2 = 100;
  }
  else {
    __assertion = "!(handle->flags & UV_UDP_PROCESSING)";
    uVar2 = 0x5c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/3rdparty/libuv/src/unix/udp.c"
                ,uVar2,"void uv__udp_run_completed(uv_udp_t *)");
}

Assistant:

static void uv__udp_run_completed(uv_udp_t* handle) {
  uv_udp_send_t* req;
  QUEUE* q;

  assert(!(handle->flags & UV_UDP_PROCESSING));
  handle->flags |= UV_UDP_PROCESSING;

  while (!QUEUE_EMPTY(&handle->write_completed_queue)) {
    q = QUEUE_HEAD(&handle->write_completed_queue);
    QUEUE_REMOVE(q);

    req = QUEUE_DATA(q, uv_udp_send_t, queue);
    uv__req_unregister(handle->loop, req);

    handle->send_queue_size -= uv__count_bufs(req->bufs, req->nbufs);
    handle->send_queue_count--;

    if (req->bufs != req->bufsml)
      uv__free(req->bufs);
    req->bufs = NULL;

    if (req->send_cb == NULL)
      continue;

    /* req->status >= 0 == bytes written
     * req->status <  0 == errno
     */
    if (req->status >= 0)
      req->send_cb(req, 0);
    else
      req->send_cb(req, req->status);
  }

  if (QUEUE_EMPTY(&handle->write_queue)) {
    /* Pending queue and completion queue empty, stop watcher. */
    uv__io_stop(handle->loop, &handle->io_watcher, POLLOUT);
    if (!uv__io_active(&handle->io_watcher, POLLIN))
      uv__handle_stop(handle);
  }

  handle->flags &= ~UV_UDP_PROCESSING;
}